

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O1

Result __thiscall tonk::SessionOutgoing::PostRecovery(SessionOutgoing *this,int *bytesSentOut)

{
  pthread_mutex_t *__mutex;
  int *piVar1;
  SimpleCipher *this_00;
  uint8_t *data;
  ostringstream *this_01;
  byte bVar2;
  undefined4 uVar3;
  undefined8 *puVar4;
  long lVar5;
  uint uVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  SiameseResult SVar9;
  int iVar10;
  _func_int **pp_Var11;
  OutputWorker *this_02;
  uint8_t *puVar12;
  uint64_t uVar13;
  int *in_RDX;
  uint8_t *puVar14;
  uint uVar15;
  uint uVar16;
  SiameseRecoveryPacket recovery;
  SiameseRecoveryPacket local_1e8;
  uint8_t *local_1d8;
  int iStack_1d0;
  uint8_t *puStack_1c8;
  pthread_mutex_t *ppStack_1c0;
  undefined1 local_1b8 [392];
  
  *in_RDX = 0;
  if ((*(byte *)(bytesSentOut + 0xa9) & 1) == 0) {
    puVar4 = *(undefined8 **)(bytesSentOut + 0x82);
    if (*(int *)(puVar4 + 1) < 4) {
      local_1b8._0_8_ = *puVar4;
      this_01 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._8_4_ = Warning;
      std::__cxx11::ostringstream::ostringstream(this_01);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,(char *)puVar4[7],puVar4[8]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,"PostRecovery ignored before peer address is known",0x31);
      this_02 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_02,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(this_01);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
  }
  else {
    SVar9 = siamese_encode(*(SiameseEncoder *)(bytesSentOut + 0xb4),&local_1e8);
    uVar16 = local_1e8.DataBytes;
    if (SVar9 == Siamese_Success) {
      __mutex = (pthread_mutex_t *)(bytesSentOut + 2);
      iVar10 = pthread_mutex_lock(__mutex);
      if (iVar10 != 0) {
        std::__throw_system_error(iVar10);
      }
      puVar12 = pktalloc::Allocator::Allocate((Allocator *)(bytesSentOut + 0xc),uVar16 + 0x30);
      pthread_mutex_unlock(__mutex);
      if (puVar12 == (uint8_t *)0x0) {
        local_1b8._0_8_ = local_1b8 + 0x10;
        local_1b8._8_8_ = 0;
        local_1b8[0x10] = (ostringstream)0x0;
        pp_Var11 = (_func_int **)operator_new(0x38);
        *pp_Var11 = (_func_int *)"Out of memory";
        pp_Var11[1] = (_func_int *)(pp_Var11 + 3);
        pp_Var11[2] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var11 + 3) = 0;
        *(undefined4 *)(pp_Var11 + 5) = 0;
        pp_Var11[6] = (_func_int *)0x10;
        (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var11;
        return (Result)(ErrorResult *)this;
      }
      data = puVar12 + 0x10;
      memcpy(data,local_1e8.Data,(ulong)local_1e8.DataBytes);
      bVar2 = *(byte *)(bytesSentOut + 0x1868);
      uVar13 = *(uint64_t *)(bytesSentOut + 0xc4);
      *(uint64_t *)(bytesSentOut + 0xc4) = uVar13 + 1;
      uVar16 = 3;
      if (bVar2 == 1) {
        uVar15 = (int)uVar13 - bytesSentOut[0xbe];
        uVar16 = 0;
        if (uVar15 != 1) {
          uVar6 = -uVar15;
          if (0 < (int)uVar15) {
            uVar6 = uVar15;
          }
          uVar16 = 1;
          if (0x7e < uVar6) {
            uVar16 = 3 - (uVar6 < 0x7fff);
          }
        }
      }
      *(int *)(puVar12 + (ulong)local_1e8.DataBytes + 0x10) = (int)uVar13;
      uVar15 = ((uint)bVar2 << 5 | 0x90) + uVar16 * 4;
      puVar14 = (uint8_t *)((ulong)uVar16 + (long)(puVar12 + (ulong)local_1e8.DataBytes + 0x10));
      if ((*(byte *)(bytesSentOut + 0xb6) & 1) != 0) {
        uVar15 = uVar15 | 0x40;
        uVar3 = *(undefined4 *)((long)bytesSentOut + 0x2e1);
        *(undefined8 *)puVar14 = *(undefined8 *)((long)bytesSentOut + 0x2d9);
        *(undefined4 *)(puVar14 + 8) = uVar3;
        puVar14 = puVar14 + 0xc;
      }
      uVar16 = (int)puVar14 - (int)data;
      puVar14[3] = (uint8_t)uVar15;
      this_00 = (SimpleCipher *)(bytesSentOut + 0x8a);
      security::SimpleCipher::Cipher(this_00,data,local_1e8.DataBytes,uVar13);
      uVar7 = security::SimpleCipher::Tag(this_00,data,uVar16,uVar13);
      iVar10 = uVar16 + 6;
      uVar13 = siamese::GetTimeUsec();
      uVar8 = security::SimpleCipher::TagInt(this_00,uVar15 & 0xff | (int)(uVar13 >> 3) << 8);
      puVar14[2] = (uint8_t)(uVar13 >> 0x13);
      *(short *)puVar14 = (short)(uVar13 >> 3);
      *(uint16_t *)(puVar14 + 4) = uVar8 ^ uVar7;
      local_1d8 = data;
      iStack_1d0 = iVar10;
      puStack_1c8 = puVar12;
      ppStack_1c0 = __mutex;
      (**(code **)(**(long **)(bytesSentOut + 0x84) + 0x10))
                (*(long **)(bytesSentOut + 0x84),bytesSentOut + 0xa2,
                 *(undefined8 *)(bytesSentOut + 0x86));
      lVar5 = *(long *)(bytesSentOut + 0x88);
      LOCK();
      piVar1 = (int *)(lVar5 + 0x18);
      *piVar1 = *piVar1 - iVar10;
      UNLOCK();
      piVar1 = (int *)(lVar5 + 0x58);
      *piVar1 = *piVar1 + iVar10;
      *in_RDX = iVar10;
    }
    else if (SVar9 != Siamese_NeedMoreData) {
      local_1b8._0_8_ = local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"siamese_encode failed","");
      pp_Var11 = (_func_int **)operator_new(0x38);
      *pp_Var11 = (_func_int *)"SessionOutgoing::PostRecovery";
      pp_Var11[1] = (_func_int *)(pp_Var11 + 3);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(pp_Var11 + 1),local_1b8._0_8_,
                 (char *)(local_1b8._0_8_ + local_1b8._8_8_));
      *(undefined4 *)(pp_Var11 + 5) = 1;
      pp_Var11[6] = (_func_int *)(long)(int)SVar9;
      (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var11;
      if ((undefined1 *)local_1b8._0_8_ == local_1b8 + 0x10) {
        return (Result)(ErrorResult *)this;
      }
      operator_delete((void *)local_1b8._0_8_);
      return (Result)(ErrorResult *)this;
    }
  }
  (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = (_func_int **)0x0;
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionOutgoing::PostRecovery(int& bytesSentOut)
{
    bytesSentOut = 0;

    if (!HasPeerAddress)
    {
        Deps.Logger->Warning("PostRecovery ignored before peer address is known");
        return Result::Success();
    }

    // Generate a recovery packet using the Siamese FEC library.
    // The recovery data is only valid until the next call to siamese_encode()
    SiameseRecoveryPacket recovery;
    const int encodeResult = siamese_encode(FECEncoder, &recovery);

    if (encodeResult == Siamese_NeedMoreData) {
        return Result::Success();
    }

    if (encodeResult != Siamese_Success) {
        return Result("SessionOutgoing::PostRecovery", "siamese_encode failed", ErrorType::Siamese, encodeResult);
    }

    // Allocate space for queued datagram
    OutgoingQueuedDatagram* datagram = (OutgoingQueuedDatagram*)WriteAllocator.Allocate(
        kQueueHeaderBytes + recovery.DataBytes + protocol::kMaxOverheadBytes);
    if (!datagram) {
        return Result::OutOfMemory();
    }

    // No need to call Initialize on the OutgoingQueuedDatagram object

    uint8_t* datagramData = datagram->Data;
    unsigned messageBytes = recovery.DataBytes;

    /*
        This memory allocation and copy cannot be trivially eliminated.
        Hopefully it won't show up on a CPU profiler.

        I started working on it in the Siamese scratch-space branch.
        The problem is that the send timer does not tick fast enough to keep up
        with data rates above 1 MB/s, assuming that Asio completes one send per
        tick.  Tonk must queue up multiple FEC Recovery Datagrams per tick.
    */
    memcpy(datagramData, recovery.Data, messageBytes);

    // The following code must be kept in sync with sendQueuedDatagram().
    // It is inlined and optimized for this common case:

    // No random padding

    uint8_t* footer = datagramData + messageBytes;
    uint8_t flags = protocol::kOnlyFECMask | protocol::kConnectionMask;
    if (ShouldCompressSequenceNumbers) {
        flags |= protocol::kSeqCompMask;
    }

    // No reliable sequence number

    // Write packet nonce to header
    unsigned nonceBytes;
    NonceT nonce = writeNonce(footer, nonceBytes);
    flags |= nonceBytes << 2;
    footer += nonceBytes;

    if (ShouldAttachHandshake)
    {
        flags |= protocol::kHandshakeMask;
        const uint32_t b = siamese::ReadU32_LE(Handshake + 8);
        const uint64_t a = siamese::ReadU64_LE(Handshake);
        siamese::WriteU64_LE(footer, a);
        siamese::WriteU32_LE(footer + 8, b);
        footer += protocol::kHandshakeBytes;
    }

    // Tag checksum includes all the data before the timestamp
    const unsigned taggedBytes = (unsigned)(footer - datagramData);

    // Skip over the timestamp
    uint8_t* timestampData = footer;
    footer += protocol::kTimestampBytes;

    // Write flags
    footer[0] = flags;
    ++footer;

    Encryptor.Cipher(datagramData, messageBytes, nonce);

    // Prepare tag
    uint16_t tag = Encryptor.Tag(datagramData, taggedBytes, nonce);
    static_assert(protocol::kEncryptionTagBytes == 2, "Update this if that changes");
    uint8_t* tagData = footer;

    const unsigned sendBytes = taggedBytes + protocol::kUntaggedDatagramBytes;

    DatagramBuffer datagramBuffer;
    datagramBuffer.AllocatorForFree = &WriteAllocator;
    datagramBuffer.Data = datagramData;
    datagramBuffer.FreePtr = datagram;
    datagramBuffer.Bytes = sendBytes;

    TONK_DEBUG_ASSERT(Deps.UDPSender != nullptr);
    TONK_DEBUG_ASSERT(HasPeerAddress);

#ifdef TONK_DETAILED_STATS
    DetailStats* stats = Deps.Deets->GetWritePtr();
    stats->Stats[Stats_SiameseBytesSent] += messageBytes; // Flags bit means no message frame header
    stats->Stats[Stats_FootersBytesSent] += sendBytes - messageBytes;
#endif // TONK_DETAILED_STATS

    // Write timestamp and final tag - Reduce noise in timestamp measurements
    const uint64_t nowUsec = siamese::GetTimeUsec();
    const uint32_t timestamp24 = (uint32_t)(nowUsec >> kTime23LostBits);
    tag ^= Encryptor.TagInt(protocol::TimestampFlagTagInt(timestamp24, flags));
    siamese::WriteU24_LE(timestampData, timestamp24);
    siamese::WriteU16_LE(tagData, tag);

    // Send the data
    Deps.UDPSender->Send(
        PeerUDPAddress,
        datagramBuffer,
        Deps.ConnectionRef);

    const unsigned kCompressionSavings = 0;
    const bool kNotReliable = false;

    // Update bandwidth control
    Deps.SenderControl->OnSendDatagram(
        kCompressionSavings,
        sendBytes,
        kNotReliable);

    // Report number of bytes sent
    bytesSentOut = static_cast<int>(sendBytes);

#ifdef TONK_ENABLE_VERBOSE_OUTGOING
    ++m_Recovery;
    Deps.Logger->Info("Recovery sent. Current send rate = ", (float)m_Recovery / (float)m_Reliable);
#endif // TONK_ENABLE_VERBOSE_OUTGOING

    return Result::Success();
}